

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  pointer *__ptr;
  undefined1 *puVar8;
  fitting_result result;
  fitting_settings settings;
  undefined1 local_e8 [8];
  undefined1 local_e0 [16];
  undefined1 local_d0 [24];
  pointer local_b8;
  long local_a8;
  fitting_settings local_a0;
  
  paVar1 = &local_a0.brdf_method.field_2;
  local_a0.run_mode = normal;
  local_a0.brdf_method._M_string_length = 0;
  local_a0.brdf_method.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_a0.output_file.field_2;
  local_a0.output_file._M_string_length = 0;
  local_a0.output_file.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_a0.input_file.field_2;
  local_a0.input_file._M_string_length = 0;
  local_a0.input_file.field_2._M_local_buf[0] = '\0';
  local_a0.brdf_method._M_dataplus._M_p = (pointer)paVar1;
  local_a0.output_file._M_dataplus._M_p = (pointer)paVar2;
  local_a0.input_file._M_dataplus._M_p = (pointer)paVar3;
  bVar4 = get_fitting_settings_from_command_line(&local_a0,argc,argv);
  if (bVar4) {
    iVar6 = 0;
    iVar7 = 0;
    if (local_a0.run_mode != exit) {
      iVar7 = iVar6;
      if (local_a0.run_mode == preview_input) {
        local_e0._0_8_ = (pointer)(local_e0 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_e8 + 8),local_a0.input_file._M_dataplus._M_p,
                   local_a0.input_file._M_dataplus._M_p + local_a0.input_file._M_string_length);
        create_preview_for_file((string *)(local_e8 + 8));
        if ((pointer)local_e0._0_8_ == (pointer)(local_e0 + 0x10)) goto LAB_00147a05;
        puVar8 = (undefined1 *)((long)((array<float,_5UL> *)local_d0._0_8_)->_M_elems + 1);
        local_b8 = (pointer)local_e0._0_8_;
      }
      else {
        if (local_a0.run_mode == test) {
          run_tests();
          goto LAB_00147a05;
        }
        print_fitting_settings(&local_a0);
        build_lookup((fitting_result *)(local_d0 + 0x10),&local_a0);
        make_alf_file((fitting_result *)local_e8);
        alf::write_alf_file((alf_file *)local_e8,&local_a0.output_file);
        if (local_e8 != (undefined1  [8])0x0) {
          std::default_delete<alf::alf_file>::operator()
                    ((default_delete<alf::alf_file> *)local_e8,(alf_file *)local_e8);
        }
        if (local_b8 == (pointer)0x0) goto LAB_00147a05;
        puVar8 = (undefined1 *)(local_a8 - (long)local_b8);
      }
      operator_delete(local_b8,(ulong)puVar8);
    }
  }
  else {
    poVar5 = log_error();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Failed to set fitting settings, aborting...",0x2b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    iVar7 = 1;
    std::ostream::flush();
  }
LAB_00147a05:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.input_file._M_dataplus._M_p != paVar3) {
    operator_delete(local_a0.input_file._M_dataplus._M_p,
                    CONCAT71(local_a0.input_file.field_2._M_allocated_capacity._1_7_,
                             local_a0.input_file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.output_file._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.output_file._M_dataplus._M_p,
                    CONCAT71(local_a0.output_file.field_2._M_allocated_capacity._1_7_,
                             local_a0.output_file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.brdf_method._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.brdf_method._M_dataplus._M_p,
                    CONCAT71(local_a0.brdf_method.field_2._M_allocated_capacity._1_7_,
                             local_a0.brdf_method.field_2._M_local_buf[0]) + 1);
  }
  return iVar7;
}

Assistant:

int main(int argc, const char *argv[])
{
  try
  {
    fitting_settings settings;
    if (!get_fitting_settings_from_command_line(settings, argc, argv))
    {
      log_error() << "Failed to set fitting settings, aborting..." << std::endl;
      return EXIT_FAILURE;
    }

    if (settings.run_mode == run_mode::exit) {
      return EXIT_SUCCESS;
    }
    else if (settings.run_mode == run_mode::test) {
      run_tests();
      return EXIT_SUCCESS;
    } else if (settings.run_mode == run_mode::preview_input) {
      create_preview_for_file(settings.input_file);
      return EXIT_SUCCESS;
    }

    print_fitting_settings(settings);
    auto result = build_lookup(settings);

    auto file = make_alf_file(result);
    alf::write_alf_file(*file, settings.output_file);
  }
  catch (std::exception &exc)
  {
    log_error() << "Exception: " << exc.what() << std::endl;
    return EXIT_FAILURE;
  }
  catch (...)
  {
    log_error() << "Unknown exception has been thrown. Aborting." << std::endl;
    return EXIT_FAILURE;
  }

  return EXIT_SUCCESS;
}